

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

char * google::protobuf::FileDescriptor::SyntaxName(Syntax syntax)

{
  char *pcVar1;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (syntax == SYNTAX_UNKNOWN) {
    pcVar1 = "unknown";
  }
  else if (syntax == SYNTAX_PROTO2) {
    pcVar1 = "proto2";
  }
  else if (syntax == SYNTAX_PROTO3) {
    pcVar1 = "proto3";
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0xe5);
    other = internal::LogMessage::operator<<(&local_40,"can\'t reach here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* FileDescriptor::SyntaxName(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case SYNTAX_PROTO2:
      return "proto2";
    case SYNTAX_PROTO3:
      return "proto3";
    case SYNTAX_UNKNOWN:
      return "unknown";
  }
  GOOGLE_LOG(FATAL) << "can't reach here.";
  return nullptr;
}